

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::CheckSignature(TypeChecker *this,TypeVector *sig,char *desc)

{
  byte bVar1;
  byte bVar2;
  Result RVar3;
  pointer pTVar4;
  int iVar5;
  Enum EVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  pTVar4 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar4;
  if (lVar7 == 0) {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,sig);
    EVar6 = Ok;
  }
  else {
    uVar8 = lVar7 >> 3;
    iVar5 = -1;
    uVar9 = 0;
    bVar2 = 0;
    do {
      bVar1 = bVar2;
      RVar3 = PeekAndCheckType(this,(int)uVar8 + iVar5,pTVar4[uVar9]);
      uVar9 = uVar9 + 1;
      pTVar4 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pTVar4 >> 3;
      iVar5 = iVar5 + -1;
      bVar2 = bVar1 | RVar3.enum_ == Error;
    } while (uVar9 < uVar8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,sig);
    EVar6 = Ok;
    if ((bool)(bVar1 | RVar3.enum_ == Error)) {
      EVar6 = Error;
      PrintStackIfFailedV(this,(Result)0x1,desc,&local_48,false);
    }
  }
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar6;
}

Assistant:

Result TypeChecker::CheckSignature(const TypeVector& sig, const char* desc) {
  Result result = Result::Ok;
  for (size_t i = 0; i < sig.size(); ++i) {
    result |= PeekAndCheckType(sig.size() - i - 1, sig[i]);
  }
  PrintStackIfFailed(result, desc, sig);
  return result;
}